

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

size_t unshield_file_size(Unshield *unshield,int index)

{
  FileDescriptor *pFVar1;
  FileDescriptor *fd;
  int index_local;
  Unshield *unshield_local;
  
  pFVar1 = unshield_get_file_descriptor(unshield,index);
  if (pFVar1 == (FileDescriptor *)0x0) {
    unshield_local = (Unshield *)0x0;
  }
  else {
    unshield_local = (Unshield *)pFVar1->expanded_size;
  }
  return (size_t)unshield_local;
}

Assistant:

size_t unshield_file_size(Unshield* unshield, int index)/*{{{*/
{
  FileDescriptor* fd = unshield_get_file_descriptor(unshield, index);
  if (fd)
  {
    return fd->expanded_size;
  }
  else
    return 0;
}